

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::SharedDtor(TextClassifier *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->language_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (psVar1 != (string *)0x0) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->modelparameterdata_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (psVar1 != (string *)0x0) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
    }
    operator_delete(psVar1,0x20);
  }
  if (this->_oneof_case_[0] != 0) {
    if ((this->_oneof_case_[0] == 200) &&
       ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0)) {
      (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->_oneof_case_[0] = 0;
  }
  return;
}

Assistant:

void TextClassifier::SharedDtor() {
  language_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  modelparameterdata_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}